

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_php_generator.cc
# Opt level: O0

string * __thiscall
t_php_generator::php_includes_abi_cxx11_(string *__return_storage_ptr__,t_php_generator *this)

{
  allocator local_1a;
  undefined1 local_19;
  t_php_generator *local_18;
  t_php_generator *this_local;
  string *includes;
  
  local_19 = 0;
  local_18 = this;
  this_local = (t_php_generator *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,
             "use Thrift\\Base\\TBase;\nuse Thrift\\Type\\TType;\nuse Thrift\\Type\\TMessageType;\nuse Thrift\\Exception\\TException;\nuse Thrift\\Exception\\TProtocolException;\nuse Thrift\\Protocol\\TProtocol;\nuse Thrift\\Protocol\\TBinaryProtocolAccelerated;\nuse Thrift\\Exception\\TApplicationException;\n"
             ,&local_1a);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a);
  if ((this->json_serializable_ & 1U) != 0) {
    std::__cxx11::string::operator+=
              ((string *)__return_storage_ptr__,"use JsonSerializable;\nuse stdClass;\n");
  }
  return __return_storage_ptr__;
}

Assistant:

string t_php_generator::php_includes() {
  string includes = "use Thrift\\Base\\TBase;\n"
                    "use Thrift\\Type\\TType;\n"
                    "use Thrift\\Type\\TMessageType;\n"
                    "use Thrift\\Exception\\TException;\n"
                    "use Thrift\\Exception\\TProtocolException;\n"
                    "use Thrift\\Protocol\\TProtocol;\n"
                    "use Thrift\\Protocol\\TBinaryProtocolAccelerated;\n"
                    "use Thrift\\Exception\\TApplicationException;\n";

  if (json_serializable_) {
    includes += "use JsonSerializable;\n"
                "use stdClass;\n";
  }

  return includes;
}